

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.h
# Opt level: O1

void __thiscall icu_63::number::impl::ParsedPatternInfo::ParsedPatternInfo(ParsedPatternInfo *this)

{
  (this->super_AffixPatternProvider)._vptr_AffixPatternProvider =
       (_func_int **)&PTR__ParsedPatternInfo_0047b6d8;
  (this->pattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->pattern).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->positive).groupingSizes = 0xffffffff0000;
  (this->positive).widthExceptAffixes = 0;
  (this->positive).hasPadding = false;
  (this->positive).paddingLocation = UNUM_PAD_BEFORE_PREFIX;
  (this->positive).integerLeadingHashSigns = 0;
  (this->positive).integerTrailingHashSigns = 0;
  (this->positive).integerNumerals = 0;
  (this->positive).integerAtSigns = 0;
  (this->positive).integerTotal = 0;
  (this->positive).fractionNumerals = 0;
  (this->positive).fractionHashSigns = 0;
  (this->positive).fractionTotal = 0;
  (this->positive).hasDecimal = false;
  DecimalQuantity::DecimalQuantity(&(this->positive).rounding);
  (this->positive).exponentHasPlusSign = false;
  (this->positive).exponentZeros = 0;
  (this->positive).hasPercentSign = false;
  (this->positive).hasPerMilleSign = false;
  (this->positive).hasCurrencySign = false;
  (this->positive).hasMinusSign = false;
  (this->positive).hasPlusSign = false;
  (this->positive).prefixEndpoints.start = 0;
  (this->positive).prefixEndpoints.end = 0;
  (this->positive).suffixEndpoints.start = 0;
  (this->positive).suffixEndpoints.end = 0;
  (this->positive).paddingEndpoints.start = 0;
  (this->positive).paddingEndpoints.end = 0;
  (this->negative).groupingSizes = 0xffffffff0000;
  (this->negative).widthExceptAffixes = 0;
  (this->negative).hasPadding = false;
  (this->negative).paddingLocation = UNUM_PAD_BEFORE_PREFIX;
  (this->negative).integerLeadingHashSigns = 0;
  (this->negative).integerTrailingHashSigns = 0;
  (this->negative).integerNumerals = 0;
  (this->negative).integerAtSigns = 0;
  (this->negative).integerTotal = 0;
  (this->negative).fractionNumerals = 0;
  (this->negative).fractionHashSigns = 0;
  (this->negative).fractionTotal = 0;
  (this->negative).hasDecimal = false;
  DecimalQuantity::DecimalQuantity(&(this->negative).rounding);
  (this->negative).exponentHasPlusSign = false;
  (this->negative).exponentZeros = 0;
  (this->negative).hasPercentSign = false;
  (this->negative).hasPerMilleSign = false;
  (this->negative).hasCurrencySign = false;
  (this->negative).hasMinusSign = false;
  (this->negative).hasPlusSign = false;
  (this->negative).prefixEndpoints.start = 0;
  (this->negative).prefixEndpoints.end = 0;
  (this->negative).suffixEndpoints.start = 0;
  (this->negative).suffixEndpoints.end = 0;
  (this->negative).paddingEndpoints.start = 0;
  (this->negative).paddingEndpoints.end = 0;
  (this->state).pattern = &this->pattern;
  (this->state).offset = 0;
  this->currentSubpattern = (ParsedSubpatternInfo *)0x0;
  this->fHasNegativeSubpattern = false;
  return;
}

Assistant:

~ParsedPatternInfo() U_OVERRIDE = default;